

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManResetRefs(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  int i;
  int iVar4;
  Vec_Ptr_t *p_00;
  
  iVar4 = 0;
  while( true ) {
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
    if (iVar1 <= iVar4) break;
    pvVar2 = Vec_PtrEntry(p_00,iVar4);
    if (pvVar2 != (void *)0x0) {
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffff0000003f;
    }
    iVar4 = iVar4 + 1;
  }
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p_00,iVar4);
    if (pvVar2 != (void *)0x0) {
      uVar3 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar3 != 0) {
        *(ulong *)(uVar3 + 0x18) =
             *(ulong *)(uVar3 + 0x18) & 0xffffffff0000003f |
             (ulong)((int)*(ulong *)(uVar3 + 0x18) + 0x40U & 0xffffffc0);
      }
      uVar3 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
      if (uVar3 != 0) {
        *(ulong *)(uVar3 + 0x18) =
             *(ulong *)(uVar3 + 0x18) & 0xffffffff0000003f |
             (ulong)((int)*(ulong *)(uVar3 + 0x18) + 0x40U & 0xffffffc0);
      }
    }
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  }
  return;
}

Assistant:

void Aig_ManResetRefs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        pObj->nRefs = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) )
            Aig_ObjFanin0(pObj)->nRefs++;
        if ( Aig_ObjFanin1(pObj) )
            Aig_ObjFanin1(pObj)->nRefs++;
    }
}